

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_client_program.cpp
# Opt level: O0

int main(void)

{
  basic_ostream<char,_std::char_traits<char>_> *this;
  error_category *in_RCX;
  error_code ec_00;
  undefined1 local_20 [8];
  error_code ec;
  
  ec.m_cat._4_4_ = 0;
  boost::system::error_code::error_code((error_code *)local_20);
  ec_00.m_cat = in_RCX;
  ec_00.m_val = ec.m_val;
  ec_00._4_4_ = ec._4_4_;
  this = boost::system::operator<<
                   ((system *)&std::cout,
                    (basic_ostream<char,_std::char_traits<char>_> *)((ulong)local_20 & 0xffffffff),
                    ec_00);
  std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(void)
{
  boost::system::error_code ec;
  std::cout << ec << std::endl;
  return 0;
}